

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void do_cmd_quiver(void)

{
  wchar_t wVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  object *obj;
  
  obj = (object *)0x0;
  ppVar2 = player->upkeep;
  if (ppVar2->quiver_cnt == L'\0') {
    msg("You have nothing in your quiver.");
    return;
  }
  wVar1 = L'\x03';
  do {
    ppVar2->command_wrk = L'\b';
    _Var3 = wVar1 == L'\x03';
    do {
      if (_Var3 == false) {
        return;
      }
      screen_save();
      _Var3 = get_item(&obj,"Select Item:","Error in do_cmd_quiver(), please report.",CMD_NULL,
                       (item_tester)0x0,L'Ɵ');
      screen_load();
    } while (((!_Var3) || (obj == (object *)0x0)) || (obj->kind == (object_kind *)0x0));
    track_object(player->upkeep,obj);
    _Var3 = player_is_shapechanged(player);
    wVar1 = L'\x03';
    if (!_Var3) {
      do {
        wVar1 = context_menu_object(obj);
      } while (wVar1 == L'\x02');
    }
    ppVar2 = player->upkeep;
  } while( true );
}

Assistant:

void do_cmd_quiver(void)
{
	struct object *obj = NULL;
	int ret = 3;

	if (player->upkeep->quiver_cnt == 0) {
		msg("You have nothing in your quiver.");
		return;
	}

	/* Start in "quiver" mode */
	player->upkeep->command_wrk = (USE_QUIVER);

	/* Loop this menu until an object context menu says differently */
	while (ret == 3) {
		/* Save screen */
		screen_save();

		/* Get an item to use a context command on (Display the quiver) */
		if (get_item(&obj, "Select Item:",
				"Error in do_cmd_quiver(), please report.",
				CMD_NULL, NULL, GET_ITEM_PARAMS)) {
			/* Load screen */
			screen_load();

			if (obj && obj->kind) {
				/* Track the object */
				track_object(player->upkeep, obj);

				if (!player_is_shapechanged(player)) {
					while  ((ret = context_menu_object(obj)) == 2);
				}

				/* Stay in "quiver" mode */
				player->upkeep->command_wrk = (USE_QUIVER);
			}
		} else {
			/* Load screen */
			screen_load();

			ret = -1;
		}
	}
}